

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O1

int CfdSetReissueAsset(void *handle,void *create_handle,char *txid,uint32_t vout,
                      int64_t asset_amount,char *blinding_nonce,char *entropy,char *address,
                      char *direct_locking_script,char **asset_string)

{
  ConfidentialTransactionContext *this;
  string **ppsVar1;
  size_t sVar2;
  char *pcVar3;
  CfdException *pCVar4;
  IssuanceParameter data;
  OutPoint outpoint;
  IssuanceOutputParameter issuance_data;
  bool local_4d1;
  void *local_4d0;
  undefined1 local_4c8 [32];
  int64_t local_4a8;
  string local_4a0;
  BlindFactor local_480;
  string local_460;
  undefined1 local_440 [16];
  char local_430 [16];
  ConfidentialAssetId local_420;
  undefined **local_3f8;
  pointer local_3f0;
  OutPoint local_3d0;
  IssuanceOutputParameter local_3a8;
  
  local_4d0 = handle;
  local_4a8 = asset_amount;
  cfd::Initialize();
  ppsVar1 = (string **)&local_3a8.address.address_;
  local_3a8.address._0_8_ = ppsVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"TransactionData","");
  cfd::capi::CheckBuffer(create_handle,(string *)&local_3a8);
  if ((string **)local_3a8.address._0_8_ != ppsVar1) {
    operator_delete((void *)local_3a8.address._0_8_);
  }
  if (address == (char *)0x0 && direct_locking_script == (char *)0x0) {
    local_3a8.address._0_8_ = "cfdcapi_elements_transaction.cpp";
    local_3a8.address.witness_ver_ = 0xb2c;
    local_3a8.address.address_._M_dataplus._M_p = "CfdSetReissueAsset";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_3a8,kCfdLogLevelWarning,
               "asset address and script is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_3a8.address._0_8_ = ppsVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3a8,"Failed to parameter. asset address and script is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_3a8);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (txid == (char *)0x0) {
    local_3a8.address._0_8_ = "cfdcapi_elements_transaction.cpp";
    local_3a8.address.witness_ver_ = 0xb32;
    local_3a8.address.address_._M_dataplus._M_p = "CfdSetReissueAsset";
    cfd::core::logger::log<>((CfdSourceLocation *)&local_3a8,kCfdLogLevelWarning,"txid is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_3a8.address._0_8_ = ppsVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3a8,"Failed to parameter. txid is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_3a8);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (blinding_nonce != (char *)0x0) {
    if (entropy == (char *)0x0) {
      local_3a8.address._0_8_ = "cfdcapi_elements_transaction.cpp";
      local_3a8.address.witness_ver_ = 0xb3e;
      local_3a8.address.address_._M_dataplus._M_p = "CfdSetReissueAsset";
      cfd::core::logger::log<>
                ((CfdSourceLocation *)&local_3a8,kCfdLogLevelWarning,"entropy is null.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_3a8.address._0_8_ = &local_3a8.address.address_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3a8,"Failed to parameter. entropy is null.","");
      cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_3a8);
      __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    local_4d1 = false;
    cfd::capi::ConvertNetType(*(int *)((long)create_handle + 0x10),&local_4d1);
    this = *(ConfidentialTransactionContext **)((long)create_handle + 0x18);
    if (this != (ConfidentialTransactionContext *)0x0) {
      if (local_4d1 != true) {
        local_440._0_8_ = local_430;
        sVar2 = strlen(txid);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_440,txid,txid + sVar2);
        cfd::core::Txid::Txid((Txid *)&local_3a8,(string *)local_440);
        cfd::core::OutPoint::OutPoint(&local_3d0,(Txid *)&local_3a8,vout);
        local_3a8.address._0_8_ = &PTR__Txid_00735400;
        if ((void *)CONCAT44(local_3a8.address._12_4_,local_3a8.address.witness_ver_) != (void *)0x0
           ) {
          operator_delete((void *)CONCAT44(local_3a8.address._12_4_,local_3a8.address.witness_ver_))
          ;
        }
        if ((char *)local_440._0_8_ != local_430) {
          operator_delete((void *)local_440._0_8_);
        }
        cfd::capi::ConvertToIssuanceParameter(&local_3a8,address,direct_locking_script);
        cfd::core::Amount::Amount((Amount *)local_440,local_4a8);
        local_3a8.amount.ignore_check_ = local_440[8];
        local_3a8.amount.amount_ = local_440._0_8_;
        local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
        sVar2 = strlen(blinding_nonce);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_460,blinding_nonce,blinding_nonce + sVar2);
        cfd::core::BlindFactor::BlindFactor((BlindFactor *)local_4c8,&local_460);
        local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
        sVar2 = strlen(entropy);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4a0,entropy,entropy + sVar2);
        cfd::core::BlindFactor::BlindFactor(&local_480,&local_4a0);
        cfd::ConfidentialTransactionContext::SetAssetReissuance
                  ((IssuanceParameter *)local_440,this,&local_3d0,&local_3a8.amount,&local_3a8,
                   (BlindFactor *)local_4c8,&local_480);
        local_480._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_007354b0;
        if (local_480.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_480.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
          operator_delete(local_4a0._M_dataplus._M_p);
        }
        local_4c8._0_8_ = &PTR__BlindFactor_007354b0;
        if ((pointer)local_4c8._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_4c8._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460._M_dataplus._M_p != &local_460.field_2) {
          operator_delete(local_460._M_dataplus._M_p);
        }
        if (asset_string != (char **)0x0) {
          cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_4c8,&local_420);
          pcVar3 = cfd::capi::CreateString((string *)local_4c8);
          *asset_string = pcVar3;
          if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
            operator_delete((void *)local_4c8._0_8_);
          }
        }
        local_3f8 = &PTR__ConfidentialAssetId_00735710;
        if (local_3f0 != (pointer)0x0) {
          operator_delete(local_3f0);
        }
        local_420._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00735710;
        if (local_420.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_420.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        local_440._0_8_ = &PTR__BlindFactor_007354b0;
        if ((void *)CONCAT71(local_440._9_7_,local_440[8]) != (void *)0x0) {
          operator_delete((void *)CONCAT71(local_440._9_7_,local_440[8]));
        }
        cfd::IssuanceOutputParameter::~IssuanceOutputParameter(&local_3a8);
        local_3d0.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
        if (local_3d0.txid_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_3d0.txid_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        return 0;
      }
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_3a8.address._0_8_ = &local_3a8.address.address_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3a8,"Invalid handle state. tx is bitcoin.","");
      cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&local_3a8);
      __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_3a8.address._0_8_ = &local_3a8.address.address_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3a8,"Invalid handle state. tx is null","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&local_3a8);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_3a8.address._0_8_ = "cfdcapi_elements_transaction.cpp";
  local_3a8.address.witness_ver_ = 0xb38;
  local_3a8.address.address_._M_dataplus._M_p = "CfdSetReissueAsset";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_3a8,kCfdLogLevelWarning,"blinding_nonce is null.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_3a8.address._0_8_ = &local_3a8.address.address_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,"Failed to parameter. blinding_nonce is null.","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_3a8);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdSetReissueAsset(
    void* handle, void* create_handle, const char* txid, uint32_t vout,
    int64_t asset_amount, const char* blinding_nonce, const char* entropy,
    const char* address, const char* direct_locking_script,
    char** asset_string) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if ((address == nullptr) && (direct_locking_script == nullptr)) {
      warn(CFD_LOG_SOURCE, "asset address and script is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset address and script is null.");
    }
    if (txid == nullptr) {
      warn(CFD_LOG_SOURCE, "txid is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null.");
    }
    if (blinding_nonce == nullptr) {
      warn(CFD_LOG_SOURCE, "blinding_nonce is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. blinding_nonce is null.");
    }
    if (entropy == nullptr) {
      warn(CFD_LOG_SOURCE, "entropy is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. entropy is null.");
    }

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. tx is bitcoin.");
    }

    ConfidentialTransactionContext* tx =
        static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
    OutPoint outpoint(Txid(txid), vout);
    cfd::IssuanceOutputParameter issuance_data =
        ConvertToIssuanceParameter(address, direct_locking_script);
    issuance_data.amount = Amount(asset_amount);

    auto data = tx->SetAssetReissuance(
        outpoint, issuance_data.amount, issuance_data,
        BlindFactor(blinding_nonce), BlindFactor(entropy));

    if (asset_string != nullptr) {
      *asset_string = CreateString(data.asset.GetHex());
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}